

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sproto.c
# Opt level: O0

int sproto_pack(void *srcv,int srcsz,void *bufferv,int bufsz)

{
  int iVar1;
  int local_64;
  int j;
  int padding;
  int n;
  uint8_t *buffer;
  uint8_t *src;
  int size;
  int ff_n;
  uint8_t *ff_desstart;
  uint8_t *ff_srcstart;
  int i;
  uint8_t tmp [8];
  int bufsz_local;
  void *bufferv_local;
  int srcsz_local;
  void *srcv_local;
  
  ff_desstart = (uint8_t *)0x0;
  _size = (uint8_t *)0x0;
  src._4_4_ = 0;
  src._0_4_ = 0;
  _padding = (uint8_t *)bufferv;
  buffer = (uint8_t *)srcv;
  tmp._0_4_ = bufsz;
  unique0x10000147 = bufferv;
  for (ff_srcstart._0_4_ = 0; (int)ff_srcstart < srcsz; ff_srcstart._0_4_ = (int)ff_srcstart + 8) {
    iVar1 = ((int)ff_srcstart + 8) - srcsz;
    if (0 < iVar1) {
      memcpy((void *)((long)&ff_srcstart + 4),buffer,(long)(8 - iVar1));
      for (local_64 = 0; local_64 < iVar1; local_64 = local_64 + 1) {
        *(undefined1 *)((long)&ff_srcstart + (long)(7 - local_64) + 4) = 0;
      }
      buffer = (uint8_t *)((long)&ff_srcstart + 4);
    }
    iVar1 = pack_seg(buffer,_padding,tmp._0_4_,src._4_4_);
    tmp._0_4_ = tmp._0_4_ - iVar1;
    if (iVar1 == 10) {
      ff_desstart = buffer;
      _size = _padding;
      src._4_4_ = 1;
    }
    else if ((iVar1 == 8) && (0 < src._4_4_)) {
      src._4_4_ = src._4_4_ + 1;
      if (src._4_4_ == 0x100) {
        if (-1 < (int)tmp._0_4_) {
          write_ff(ff_desstart,_size,0x800);
        }
        src._4_4_ = 0;
      }
    }
    else if (0 < src._4_4_) {
      if (-1 < (int)tmp._0_4_) {
        write_ff(ff_desstart,_size,src._4_4_ << 3);
      }
      src._4_4_ = 0;
    }
    buffer = buffer + 8;
    _padding = _padding + iVar1;
    src._0_4_ = iVar1 + (int)src;
  }
  if (-1 < (int)tmp._0_4_) {
    if (src._4_4_ == 1) {
      write_ff(ff_desstart,_size,8);
    }
    else if (1 < src._4_4_) {
      write_ff(ff_desstart,_size,srcsz - ((int)ff_desstart - (int)srcv));
    }
  }
  return (int)src;
}

Assistant:

int
sproto_pack(const void * srcv, int srcsz, void * bufferv, int bufsz) {
	uint8_t tmp[8];
	int i;
	const uint8_t * ff_srcstart = NULL;
	uint8_t * ff_desstart = NULL;
	int ff_n = 0;
	int size = 0;
	const uint8_t * src = srcv;
	uint8_t * buffer = bufferv;
	for (i=0;i<srcsz;i+=8) {
		int n;
		int padding = i+8 - srcsz;
		if (padding > 0) {
			int j;
			memcpy(tmp, src, 8-padding);
			for (j=0;j<padding;j++) {
				tmp[7-j] = 0;
			}
			src = tmp;
		}
		n = pack_seg(src, buffer, bufsz, ff_n);
		bufsz -= n;
		if (n == 10) {
			// first FF
			ff_srcstart = src;
			ff_desstart = buffer;
			ff_n = 1;
		} else if (n==8 && ff_n>0) {
			++ff_n;
			if (ff_n == 256) {
				if (bufsz >= 0) {
					write_ff(ff_srcstart, ff_desstart, 256*8);
				}
				ff_n = 0;
			}
		} else {
			if (ff_n > 0) {
				if (bufsz >= 0) {
					write_ff(ff_srcstart, ff_desstart, ff_n*8);
				}
				ff_n = 0;
			}
		}
		src += 8;
		buffer += n;
		size += n;
	}
	if(bufsz >= 0){
		if(ff_n == 1)
			write_ff(ff_srcstart, ff_desstart, 8);
		else if (ff_n > 1)
			write_ff(ff_srcstart, ff_desstart, srcsz - (intptr_t)(ff_srcstart - (const uint8_t*)srcv));
	}
	return size;
}